

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool property_from_palette_replace_placeholder_proc
               (Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object palette_value_obj;
  Am_Object palette;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
  }
  else {
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    pAVar2 = Am_Object::Get(ph,Am_REGISTRY_FOR_PALETTES,0);
    Am_Object::Am_Object(&palette,pAVar2);
    pAVar2 = Am_Object::Get(&palette,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    if (new_value->type == 0xa001) {
      Am_Object::Am_Object(&palette_value_obj,new_value);
      pAVar2 = Am_Object::Get(&palette_value_obj,0x6a,1);
      Am_Value::operator=(new_value,pAVar2);
      Am_Object::~Am_Object(&palette_value_obj);
    }
    if (am_sdebug == true) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Got value ");
      poVar3 = operator<<(poVar3,new_value);
      poVar3 = std::operator<<(poVar3," from palette ");
      poVar3 = operator<<(poVar3,&palette);
      poVar3 = std::operator<<(poVar3," for ");
      poVar3 = operator<<(poVar3,ph);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ostream::flush();
    }
    Am_Object::~Am_Object(&palette);
  }
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 property_from_palette_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    Am_Object palette = ph.Get(Am_REGISTRY_FOR_PALETTES);
    new_value = palette.Get(Am_VALUE);
    if (new_value.type == Am_OBJECT) {
      Am_Object palette_value_obj = new_value;
      new_value = palette_value_obj.Peek(Am_FILL_STYLE);
    }
    if (am_sdebug)
      std::cout << "Got value " << new_value << " from palette " << palette
                << " for " << ph << std::endl
                << std::flush;
    return true;
  }
}